

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O0

QJsonObject convertToJsonObject(QCborContainerPrivate *d,ConversionMode mode)

{
  long lVar1;
  qsizetype qVar2;
  long in_RSI;
  QExplicitlySharedDataPointer<QCborContainerPrivate> in_RDI;
  long in_FS_OFFSET;
  iterator iVar3;
  qsizetype idx;
  QJsonObject *o;
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 in_stack_ffffffffffffff68;
  QExplicitlySharedDataPointer<QCborContainerPrivate> this;
  ConversionMode in_stack_ffffffffffffff9c;
  qsizetype in_stack_ffffffffffffffa0;
  QCborContainerPrivate *key;
  QCborContainerPrivate *d_00;
  QExplicitlySharedDataPointer<QCborContainerPrivate> idx_00;
  QCborContainerPrivate *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  this.d.ptr = in_RDI.d.ptr;
  idx_00.d.ptr = in_RDI.d.ptr;
  QJsonObject::QJsonObject((QJsonObject *)0x488f37);
  if (in_RSI != 0) {
    key = (QCborContainerPrivate *)0x0;
    while (d_00 = key,
          qVar2 = QList<QtCbor::Element>::size((QList<QtCbor::Element> *)(in_RSI + 0x28)),
          (long)key < qVar2) {
      makeString(in_stack_ffffffffffffffc8,(qsizetype)idx_00.d.ptr,
                 (ConversionMode)((ulong)in_RSI >> 0x20));
      qt_convertToJson(d_00,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      iVar3 = QJsonObject::insert((QJsonObject *)this.d.ptr,(QString *)key,
                                  (QJsonValue *)in_stack_ffffffffffffff68.a);
      in_stack_ffffffffffffff68 = iVar3.item.super_QJsonValueConstRef.field_0;
      QJsonValue::~QJsonValue((QJsonValue *)0x488ff1);
      QString::~QString((QString *)0x488ffb);
      key = (QCborContainerPrivate *)
            ((long)&(d_00->super_QSharedData).ref.super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

static QJsonObject convertToJsonObject(QCborContainerPrivate *d,
                                       ConversionMode mode = ConversionMode::FromRaw)
{
    QJsonObject o;
    if (d) {
        for (qsizetype idx = 0; idx < d->elements.size(); idx += 2)
            o.insert(makeString(d, idx), qt_convertToJson(d, idx + 1, mode));
    }
    return o;
}